

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq_word_validation_test.c
# Opt level: O0

_Bool is_acceptable(automaton *a,char state)

{
  size_t sVar1;
  int local_2c;
  int i;
  size_t acceptable_states_length;
  char state_local;
  automaton *a_local;
  
  sVar1 = strlen(a->acceptable_states);
  local_2c = 0;
  while( true ) {
    if ((int)sVar1 <= local_2c) {
      return false;
    }
    if (a->acceptable_states[local_2c] == state) break;
    local_2c = local_2c + 1;
  }
  return true;
}

Assistant:

bool is_acceptable(const automaton * a, char state) {
    assert(state >= 0 + STR_STORAGE_VAL_OFFSET);
    assert(state < a->states_size + STR_STORAGE_VAL_OFFSET);

    size_t acceptable_states_length = strlen(a->acceptable_states);
    int i;
    for(i=0; i<(int)acceptable_states_length; i++) {
        if(a->acceptable_states[i] == state) {
            return true;
        }
    }
    assert(i == acceptable_states_length);
    return false;
}